

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void EDCircles::AperB(double **_A,double **_B,double **_res,int _righA,int _colA,int _righB,
                     int _colB)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  uVar2 = (ulong)(uint)_colA;
  if (_colA < 1) {
    uVar2 = 0;
  }
  if (_colB < 1) {
    _colB = 0;
  }
  if (_righA < 1) {
    _righA = 0;
  }
  for (uVar3 = 1; uVar3 != _righA + 1; uVar3 = uVar3 + 1) {
    for (uVar4 = 1; uVar4 != _colB + 1; uVar4 = uVar4 + 1) {
      pdVar1 = _res[uVar3];
      pdVar1[uVar4] = 0.0;
      dVar6 = 0.0;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        dVar6 = dVar6 + _A[uVar3][uVar5 + 1] * _B[uVar5 + 1][uVar4];
        pdVar1[uVar4] = dVar6;
      }
    }
  }
  return;
}

Assistant:

void EDCircles::AperB(double ** _A, double ** _B, double ** _res, int _righA, int _colA, int _righB, int _colB)
{
	int p, q, l;
	for (p = 1; p <= _righA; p++)
		for (q = 1; q <= _colB; q++)
		{
			_res[p][q] = 0.0;
			for (l = 1; l <= _colA; l++)
				_res[p][q] = _res[p][q] + _A[p][l] * _B[l][q];
		}
}